

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O0

void __thiscall
Iir::Biquad::setTwoPole
          (Biquad *this,complex_t pole1,complex_t zero1,complex_t pole2,complex_t zero2)

{
  bool bVar1;
  double in_RDI;
  double dVar2;
  double extraout_XMM0_Qa;
  Biquad *this_00;
  double dVar3;
  double b2;
  double b1;
  double b0;
  char errMsgZero [64];
  char errMsgPole [64];
  double a2;
  double a1;
  double a0;
  complex<double> *in_stack_fffffffffffffec0;
  complex<double> *in_stack_fffffffffffffec8;
  complex<double> *in_stack_fffffffffffffed0;
  double in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  undefined1 local_e8 [64];
  undefined1 local_a8 [72];
  double local_60;
  double local_58;
  undefined8 local_50;
  complex<double> local_40;
  complex<double> local_30;
  complex<double> local_20;
  complex<double> local_10;
  
  local_50 = 0x3ff0000000000000;
  memcpy(local_a8,"imaginary parts of both poles need to be 0 or complex conjugate",0x40);
  memcpy(local_e8,"imaginary parts of both zeros need to be 0 or complex conjugate",0x40);
  dVar2 = std::complex<double>::imag_abi_cxx11_(&local_10);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    std::conj<double>(in_stack_fffffffffffffec0);
    bVar1 = std::operator!=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (bVar1) {
      throw_invalid_argument((char *)in_stack_fffffffffffffed0);
    }
    local_58 = std::complex<double>::real_abi_cxx11_(&local_10);
    local_58 = local_58 * -2.0;
    local_60 = std::norm<double>((complex<double> *)0x102ffe);
  }
  else {
    dVar2 = std::complex<double>::imag_abi_cxx11_(&local_30);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      throw_invalid_argument((char *)in_stack_fffffffffffffed0);
    }
    in_stack_fffffffffffffec8 = (complex<double> *)std::complex<double>::real_abi_cxx11_(&local_10);
    dVar2 = std::complex<double>::real_abi_cxx11_(&local_30);
    local_58 = -((double)in_stack_fffffffffffffec8 + dVar2);
    in_stack_fffffffffffffed0 = (complex<double> *)std::complex<double>::real_abi_cxx11_(&local_10);
    local_60 = std::complex<double>::real_abi_cxx11_(&local_30);
    local_60 = (double)in_stack_fffffffffffffed0 * local_60;
  }
  dVar2 = std::complex<double>::imag_abi_cxx11_(&local_20);
  dVar3 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    std::conj<double>(in_stack_fffffffffffffec0);
    in_stack_fffffffffffffee0 = extraout_XMM0_Qa;
    bVar1 = std::operator!=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    in_stack_fffffffffffffee8 = dVar3;
    if (bVar1) {
      throw_invalid_argument((char *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffee8 = dVar3;
    }
    std::complex<double>::real_abi_cxx11_(&local_20);
    this_00 = (Biquad *)std::norm<double>((complex<double> *)0x103148);
  }
  else {
    dVar2 = std::complex<double>::imag_abi_cxx11_(&local_40);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      throw_invalid_argument((char *)in_stack_fffffffffffffed0);
    }
    std::complex<double>::real_abi_cxx11_(&local_20);
    std::complex<double>::real_abi_cxx11_(&local_40);
    in_stack_fffffffffffffec0 = (complex<double> *)std::complex<double>::real_abi_cxx11_(&local_20);
    dVar2 = std::complex<double>::real_abi_cxx11_(&local_40);
    this_00 = (Biquad *)((double)in_stack_fffffffffffffec0 * dVar2);
  }
  setCoefficients(this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_RDI,
                  (double)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8,
                  (double)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void Biquad::setTwoPole (complex_t pole1, complex_t zero1,
				     complex_t pole2, complex_t zero2)
	{
		const double a0 = 1;
		double a1;
		double a2;
		const char errMsgPole[] = "imaginary parts of both poles need to be 0 or complex conjugate";
		const char errMsgZero[] = "imaginary parts of both zeros need to be 0 or complex conjugate";

		if (pole1.imag() != 0)
		{
			if (pole2 != std::conj (pole1))
				throw_invalid_argument(errMsgPole);
			a1 = -2 * pole1.real();
			a2 = std::norm (pole1);
		}
		else
		{
			if (pole2.imag() != 0)
				throw_invalid_argument(errMsgPole);
			a1 = -(pole1.real() + pole2.real());
			a2 =   pole1.real() * pole2.real();
		}

		const double b0 = 1;
		double b1;
		double b2;

		if (zero1.imag() != 0)
		{
			if (zero2 != std::conj (zero1))
				throw_invalid_argument(errMsgZero);
			b1 = -2 * zero1.real();
			b2 = std::norm (zero1);
		}
		else
		{
			if (zero2.imag() != 0)
				throw_invalid_argument(errMsgZero);

			b1 = -(zero1.real() + zero2.real());
			b2 =   zero1.real() * zero2.real();
		}

		setCoefficients (a0, a1, a2, b0, b1, b2);
	}